

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_UInt FT_Get_Char_Index(FT_Face face,FT_ULong charcode)

{
  FT_CMap_conflict cmap;
  FT_UInt result;
  FT_ULong charcode_local;
  FT_Face face_local;
  
  cmap._4_4_ = 0;
  if (((face != (FT_Face)0x0) && (face->charmap != (FT_CharMap)0x0)) &&
     (cmap._4_4_ = (*(code *)(face->charmap[1].face)->style_flags)
                             (face->charmap,charcode & 0xffffffff),
     (uint)face->num_glyphs <= cmap._4_4_)) {
    cmap._4_4_ = 0;
  }
  return cmap._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_UInt )
  FT_Get_Char_Index( FT_Face   face,
                     FT_ULong  charcode )
  {
    FT_UInt  result = 0;


    if ( face && face->charmap )
    {
      FT_CMap  cmap = FT_CMAP( face->charmap );


      if ( charcode > 0xFFFFFFFFUL )
      {
        FT_TRACE1(( "FT_Get_Char_Index: too large charcode" ));
        FT_TRACE1(( " 0x%x is truncated\n", charcode ));
      }

      result = cmap->clazz->char_index( cmap, (FT_UInt32)charcode );
      if ( result >= (FT_UInt)face->num_glyphs )
        result = 0;
    }

    return result;
  }